

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int pager_fill_page(Pager *pPager,pgno iNum,void *pContents)

{
  sxu32 sVar1;
  Page *in_RAX;
  
  if (pPager->nPage != 0) {
    for (in_RAX = pPager->apHash[(uint)iNum & pPager->nSize - 1]; in_RAX != (Page *)0x0;
        in_RAX = in_RAX->pNextCollide) {
      if (in_RAX->pgno == iNum) {
        sVar1 = SyMemcpy(pContents,in_RAX->zData,pPager->iPageSize);
        return sVar1;
      }
    }
  }
  return (int)in_RAX;
}

Assistant:

static Page * pager_fetch_page(Pager *pPager,pgno page_num)
{
	Page *pEntry;
	if( pPager->nPage < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	/* Perform the lookup */
	pEntry = pPager->apHash[PAGE_HASH(page_num) & (pPager->nSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->pgno == page_num ){
			return pEntry;
		}
		/* Point to the next entry in the colission chain */
		pEntry = pEntry->pNextCollide;
	}
	/* No such page */
	return 0;
}